

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O3

SceneSignal __thiscall GroundScene::update(GroundScene *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  pointer ppOVar5;
  int extraout_var;
  ulong uVar6;
  pointer ppOVar7;
  ulong uVar8;
  ulong uVar9;
  int j;
  long lVar10;
  pointer __src;
  Object *pOVar11;
  Object *pOVar12;
  Plant *(*papPVar13) [10];
  int i;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  stringstream debugString;
  string local_1d8;
  ObjectSignal local_1b8;
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  uVar1 = this->score;
  if (uVar1 == 0) {
    uVar4 = 10;
  }
  else {
    this->score = 0;
    uVar4 = 0xd;
  }
  ppOVar7 = (this->objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar3 = this->sunVectorN;
  papPVar13 = this->plants;
  lVar14 = 0;
  do {
    lVar10 = 0;
    do {
      if (((*papPVar13)[lVar10] != (Plant *)0x0) &&
         (iVar2 = (*((*papPVar13)[lVar10]->super_Charactor).super_Object._vptr_Object[3])(),
         (char)iVar2 != '\0')) {
        (*papPVar13)[lVar10] = (Plant *)0x0;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 10);
    lVar14 = lVar14 + 1;
    papPVar13 = papPVar13 + 1;
  } while (lVar14 != 5);
  ppOVar7 = ppOVar7 + iVar3;
  ppOVar5 = ppOVar7;
  if (ppOVar7 !=
      (this->objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      iVar3 = (*(*ppOVar5)->_vptr_Object[3])();
      if ((char)iVar3 == '\0') {
        ppOVar5 = ppOVar5 + 1;
        ppOVar7 = (this->objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      else {
        __src = ppOVar5 + 1;
        ppOVar7 = (this->objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (__src != ppOVar7) {
          memmove(ppOVar5,__src,(long)ppOVar7 - (long)__src);
          ppOVar7 = (this->objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        }
        ppOVar7 = ppOVar7 + -1;
        (this->objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppOVar7;
      }
    } while (ppOVar5 != ppOVar7);
  }
  if (this->count == 0x50) {
    genSunRandom(this);
    ppOVar7 = (this->objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    iVar3 = 0;
  }
  else {
    iVar3 = this->count + 1;
  }
  this->count = iVar3;
  iVar3 = this->sunVectorN;
  ppOVar5 = (this->objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((ulong)(long)iVar3 < (ulong)((long)ppOVar7 - (long)ppOVar5 >> 3)) {
    uVar8 = (ulong)(iVar3 + 1);
    uVar9 = (long)iVar3;
    do {
      uVar16 = uVar9 + 1;
      uVar6 = (long)ppOVar7 - (long)ppOVar5 >> 3;
      if (uVar16 < uVar6) {
        iVar3 = ppOVar5[uVar9]->type % 10;
        uVar15 = uVar8;
        do {
          pOVar12 = ppOVar5[uVar15];
          iVar2 = pOVar12->type % 10;
          if (iVar3 != iVar2) {
            if ((iVar3 == 5) && (iVar2 == 4)) {
              (*ppOVar5[uVar9]->_vptr_Object[7])();
            }
            else if ((iVar3 == 3) && (iVar2 == 4)) {
              (*ppOVar5[uVar9]->_vptr_Object[0x11])();
              ppOVar7 = (this->objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              pOVar12 = ppOVar7[uVar15];
              pOVar11 = ppOVar7[uVar9];
LAB_0010d0e2:
              (*pOVar12->_vptr_Object[0xe])(pOVar12,pOVar11);
            }
            else if (iVar3 == 4) {
              if (iVar2 == 5) {
                (*pOVar12->_vptr_Object[7])(pOVar12,ppOVar5[uVar9]);
              }
              else if (iVar2 == 3) {
                (*pOVar12->_vptr_Object[0x11])(pOVar12,ppOVar5[uVar9]);
                ppOVar7 = (this->objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                pOVar12 = ppOVar7[uVar9];
                pOVar11 = ppOVar7[uVar15];
                goto LAB_0010d0e2;
              }
            }
          }
          uVar15 = uVar15 + 1;
          ppOVar5 = (this->objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          ppOVar7 = (this->objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          uVar6 = (long)ppOVar7 - (long)ppOVar5 >> 3;
        } while (uVar15 < uVar6);
      }
      uVar8 = uVar8 + 1;
      uVar9 = uVar16;
    } while (uVar16 < uVar6);
  }
  if (ppOVar7 != ppOVar5) {
    uVar9 = 0;
    do {
      (**ppOVar5[uVar9]->_vptr_Object)();
      local_1b8.type =
           (*(this->objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
             super__Vector_impl_data._M_start[uVar9]->_vptr_Object[2])();
      local_1b8.data = extraout_var;
      processObjSignal(this,&local_1b8);
      if (this->state == 5) {
        uVar4 = 0xe;
        goto LAB_0010d25d;
      }
      uVar9 = uVar9 + 1;
      ppOVar5 = (this->objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)((long)(this->objects).
                                   super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)ppOVar5 >> 3));
  }
  randomGenZombie(this);
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"n: ",3);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__cxx11::stringbuf::str();
  drawText(0,0x2f,&local_1d8,0,0xf);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
  std::ios_base::~ios_base(local_138);
LAB_0010d25d:
  return (SceneSignal)((ulong)uVar1 << 0x20 | uVar4);
}

Assistant:

SceneSignal GroundScene::update(){
	SceneSignal signal(GS_SIGNAL_NULL, 0);
	if(score != 0){
		signal.type = GS_SIGNAL_ADD_SCORE;
		signal.data = score;
		score = 0;
	}
	std::vector<Object*>::iterator ite = objects.begin()+sunVectorN;
	for(int i = 0; i < GSBH; ++i){
		for(int j = 0; j < GSBW; ++j){
			if(plants[i][j] != NULL && plants[i][j]->getIsDead()){
				plants[i][j] = NULL;
			}
		}
	}
	while(ite != objects.end()){
		if((*ite)->getIsDead()){
			ite = objects.erase(ite);
		}
		else{
			ite++;
		}
	}
	if(count == SUNFLOWER_GEN_SUN_SPEED){
		genSunRandom();
		count = 0;
	}
	else{
		count++;
	}
	for(int i = sunVectorN; i < objects.size(); ++i){
		int type0 = objects[i]->type%10;
		for(int j = i+1; j < objects.size(); ++j){
			int type1 = objects[j]->type%10;
			if(type0 == type1){
				continue;
			}
			else{
				if(type0 == OBJ_TYPE_BULLET && type1 == OBJ_TYPE_ZOMBIE){
					/* drawText(0, SH+2, "here1", BLACK, WHITE); */
					((Bullet*)objects[i])->interactive((Zombie*)objects[j]);
				}
				else if(type0 == OBJ_TYPE_PLANT && type1 == OBJ_TYPE_ZOMBIE){
					((Plant*)objects[i])->interactive((Zombie*)objects[j]);
					((Zombie*)objects[j])->interactive((Plant*)objects[i]);
				}
				else if(type0 == OBJ_TYPE_ZOMBIE){
					if(type1 == OBJ_TYPE_PLANT){
						((Plant*)objects[j])->interactive((Zombie*)objects[i]);
						((Zombie*)objects[i])->interactive((Plant*)objects[j]);
					}
					else if(type1 == OBJ_TYPE_BULLET){
						/* drawText(0, SH+2, "here2", BLACK, WHITE); */
						((Bullet*)objects[j])->interactive((Zombie*)objects[i]);
					}
				}
			}
		}
	}
	for(int i = 0; i < objects.size(); ++i){
		objects[i]->update();
		ObjectSignal os = objects[i]->getSignal();
		processObjSignal(os);
		if(state == STATE_OVER){
			signal.type = GS_SIGNAL_OVER; 
			return signal;
		}
	}
	randomGenZombie();


	std::stringstream debugString;
	debugString << "n: " << objects.size();
	drawText(0, SH+1, debugString.str(), BLACK, WHITE);
	return signal;
}